

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metablock.cpp
# Opt level: O2

void duckdb_brotli::BrotliBuildMetaBlockGreedy
               (MemoryManager *m,uint8_t *ringbuffer,size_t pos,size_t mask,uint8_t prev_byte,
               uint8_t prev_byte2,ContextLut literal_context_lut,size_t num_contexts,
               uint32_t *static_context_map,Command *commands,size_t n_commands,MetaBlockSplit *mb)

{
  BlockSplitterCommand *pBVar1;
  int *piVar2;
  long *plVar3;
  byte bVar4;
  ushort uVar5;
  ushort uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  size_t __n;
  undefined1 auVar10 [16];
  BlockSplitterLiteral *self;
  Command *pCVar11;
  double dVar12;
  ulong uVar13;
  uint8_t *__dest;
  ulong uVar14;
  uint32_t *puVar15;
  HistogramLiteral *__s;
  size_t sVar16;
  size_t sVar17;
  ulong uVar18;
  long lVar19;
  BlockSplitterDistance *pBVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  uint uVar24;
  bool bVar25;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  HistogramCommand **in_stack_ffffffffffffff48;
  MemoryManager *m_00;
  MemoryManager *m_01;
  size_t local_88;
  
  uVar18 = (ulong)prev_byte2;
  uVar22 = (ulong)prev_byte;
  self = (BlockSplitterLiteral *)BrotliAllocate(m,0x30c8);
  local_88 = pos;
  if (num_contexts == 1) {
    sVar17 = 0;
    pCVar11 = commands;
    sVar16 = n_commands;
    while (bVar25 = sVar16 != 0, sVar16 = sVar16 - 1, bVar25) {
      sVar17 = sVar17 + pCVar11->insert_len_;
      pCVar11 = pCVar11 + 1;
    }
    m_01 = m;
    InitBlockSplitterLiteral
              (m,self,sVar17,(size_t)mb,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da),
               (size_t)&mb->literal_histograms,(BlockSplit *)&mb->literal_histograms_size,
               (HistogramLiteral **)in_stack_ffffffffffffff48,(size_t *)m);
    pBVar1 = (BlockSplitterCommand *)(self + 1);
    InitBlockSplitterCommand
              (m,pBVar1,n_commands,(size_t)&mb->command_split,
               (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00),
               (size_t)&mb->command_histograms,(BlockSplit *)&mb->command_histograms_size,
               in_stack_ffffffffffffff48,(size_t *)m_01);
    pBVar20 = (BlockSplitterDistance *)(self[3].combined_histo[1].data_ + 0x48);
    InitBlockSplitterDistance
              (m,pBVar20,n_commands,(size_t)&mb->distance_split,
               (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01),
               (size_t)&mb->distance_histograms,(BlockSplit *)&mb->distance_histograms_size,
               (HistogramDistance **)in_stack_ffffffffffffff48,(size_t *)m_01);
    for (sVar16 = 0; sVar16 != n_commands; sVar16 = sVar16 + 1) {
      uVar7 = commands[sVar16].insert_len_;
      uVar24 = commands[sVar16].copy_len_;
      uVar5 = commands[sVar16].cmd_prefix_;
      uVar6 = commands[sVar16].dist_prefix_;
      BlockSplitterAddSymbolCommand(pBVar1,(ulong)uVar5);
      sVar17 = local_88;
      for (lVar19 = 0; -lVar19 != (ulong)uVar7; lVar19 = lVar19 + -1) {
        BlockSplitterAddSymbolLiteral(self,(ulong)ringbuffer[sVar17 & mask]);
        sVar17 = sVar17 + 1;
      }
      uVar24 = uVar24 & 0x1ffffff;
      if ((uVar24 != 0) && (0x7f < uVar5)) {
        BlockSplitterAddSymbolDistance(pBVar20,(ulong)(uVar6 & 0x3ff));
      }
      local_88 = (local_88 + uVar24) - lVar19;
    }
    BlockSplitterFinishBlockLiteral(self,1);
    BlockSplitterFinishBlockCommand(pBVar1,1);
    BlockSplitterFinishBlockDistance(pBVar20,1);
  }
  else {
    uVar23 = 0;
    pCVar11 = commands;
    sVar16 = n_commands;
    while (bVar25 = sVar16 != 0, sVar16 = sVar16 - 1, bVar25) {
      uVar23 = uVar23 + pCVar11->insert_len_;
      pCVar11 = pCVar11 + 1;
    }
    self->alphabet_size_ = 0x100;
    self->min_block_size_ = num_contexts;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = num_contexts;
    dVar12 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x100)) / auVar10,0);
    self->split_threshold_ = dVar12;
    self->num_blocks_ = 0x200;
    self->split_ = (BlockSplit *)0x4079000000000000;
    self->histograms_ = (HistogramLiteral *)0x0;
    uVar23 = uVar23 >> 9;
    uVar21 = uVar23 + 1;
    self->histograms_size_ = (size_t *)mb;
    *(size_t **)(self->combined_histo[0].data_ + 2) = &mb->literal_histograms_size;
    self->combined_histo[0].data_[4] = 0x200;
    self->combined_histo[0].data_[5] = 0;
    self->combined_histo[0].data_[0x42] = 0;
    self->combined_histo[0].data_[0x43] = 0;
    uVar13 = (long)dVar12 + 1;
    if (uVar21 < uVar13) {
      uVar13 = uVar21;
    }
    self->combined_histo[0].data_[6] = 0;
    self->combined_histo[0].data_[7] = 0;
    self->combined_histo[0].data_[8] = 0;
    self->combined_histo[0].data_[9] = 0;
    uVar9 = (mb->literal_split).types_alloc_size;
    if (uVar9 <= uVar23) {
      if (uVar9 == 0) {
        uVar9 = uVar21;
      }
      do {
        uVar14 = uVar9;
        uVar9 = uVar14 * 2;
      } while (uVar14 <= uVar23);
      __dest = (uint8_t *)BrotliAllocate(m,uVar14);
      __n = (mb->literal_split).types_alloc_size;
      if (__n != 0) {
        switchD_0036ecca::default(__dest,(mb->literal_split).types,__n);
      }
      BrotliFree(m,(mb->literal_split).types);
      (mb->literal_split).types = __dest;
      (mb->literal_split).types_alloc_size = uVar14;
    }
    uVar9 = (mb->literal_split).lengths_alloc_size;
    if (uVar9 <= uVar23) {
      if (uVar9 == 0) {
        uVar9 = uVar21;
      }
      do {
        uVar14 = uVar9;
        uVar9 = uVar14 * 2;
      } while (uVar14 <= uVar23);
      puVar15 = (uint32_t *)BrotliAllocate(m,uVar14 * 4);
      sVar16 = (mb->literal_split).lengths_alloc_size;
      if (sVar16 != 0) {
        switchD_0036ecca::default(puVar15,(mb->literal_split).lengths,sVar16 << 2);
      }
      BrotliFree(m,(mb->literal_split).lengths);
      (mb->literal_split).lengths = puVar15;
      (mb->literal_split).lengths_alloc_size = uVar14;
    }
    (mb->literal_split).num_blocks = uVar21;
    sVar16 = uVar13 * num_contexts;
    mb->literal_histograms_size = sVar16;
    if (sVar16 == 0) {
      __s = (HistogramLiteral *)0x0;
    }
    else {
      __s = (HistogramLiteral *)BrotliAllocate(m,sVar16 * 0x410);
    }
    mb->literal_histograms = __s;
    *(HistogramLiteral **)self->combined_histo[0].data_ = __s;
    sVar16 = num_contexts;
    while (bVar25 = sVar16 != 0, sVar16 = sVar16 - 1, bVar25) {
      memset(__s,0,0x408);
      __s->bit_cost_ = INFINITY;
      __s = __s + 1;
    }
    self->combined_histo[0].data_[10] = 0;
    self->combined_histo[0].data_[0xb] = 0;
    self->combined_histo[0].data_[0xc] = 0;
    self->combined_histo[0].data_[0xd] = 0;
    pBVar1 = (BlockSplitterCommand *)(self + 1);
    m_00 = m;
    InitBlockSplitterCommand
              (m,pBVar1,n_commands,(size_t)&mb->command_split,0.0,(size_t)&mb->command_histograms,
               (BlockSplit *)&mb->command_histograms_size,in_stack_ffffffffffffff48,(size_t *)m);
    pBVar20 = (BlockSplitterDistance *)(self[3].combined_histo[1].data_ + 0x48);
    InitBlockSplitterDistance
              (m,pBVar20,n_commands,(size_t)&mb->distance_split,
               (double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02),
               (size_t)&mb->distance_histograms,(BlockSplit *)&mb->distance_histograms_size,
               (HistogramDistance **)in_stack_ffffffffffffff48,(size_t *)m_00);
    for (sVar16 = 0; sVar16 != n_commands; sVar16 = sVar16 + 1) {
      uVar7 = commands[sVar16].insert_len_;
      uVar24 = commands[sVar16].copy_len_;
      uVar5 = commands[sVar16].cmd_prefix_;
      uVar6 = commands[sVar16].dist_prefix_;
      BlockSplitterAddSymbolCommand(pBVar1,(ulong)uVar5);
      for (uVar23 = 0; uVar7 != uVar23; uVar23 = uVar23 + 1) {
        bVar4 = ringbuffer[local_88 + uVar23 & mask];
        uVar8 = static_context_map
                [literal_context_lut[uVar18 + 0x100] | literal_context_lut[uVar22]];
        lVar19 = *(long *)(self->combined_histo[0].data_ + 8) * 0x410 +
                 *(long *)self->combined_histo[0].data_;
        piVar2 = (int *)(lVar19 + (ulong)uVar8 * 0x410 + (ulong)bVar4 * 4);
        *piVar2 = *piVar2 + 1;
        plVar3 = (long *)((ulong)uVar8 * 0x410 + 0x400 + lVar19);
        *plVar3 = *plVar3 + 1;
        lVar19 = *(long *)(self->combined_histo[0].data_ + 6) + 1;
        *(long *)(self->combined_histo[0].data_ + 6) = lVar19;
        if (lVar19 == *(long *)(self->combined_histo[0].data_ + 4)) {
          ContextBlockSplitterFinishBlock((ContextBlockSplitter *)self,m_00,0);
        }
        uVar18 = uVar22;
        uVar22 = (ulong)bVar4;
      }
      uVar21 = (ulong)(uVar24 & 0x1ffffff);
      if ((uVar24 & 0x1ffffff) != 0) {
        lVar19 = local_88 + uVar21;
        uVar18 = (ulong)ringbuffer[(uVar23 + lVar19) - 2 & mask];
        uVar22 = (ulong)ringbuffer[(uVar23 + lVar19) - 1 & mask];
        if (0x7f < uVar5) {
          BlockSplitterAddSymbolDistance(pBVar20,(ulong)(uVar6 & 0x3ff));
        }
      }
      local_88 = local_88 + uVar23 + uVar21;
    }
    m_01 = m_00;
    ContextBlockSplitterFinishBlock((ContextBlockSplitter *)self,m_00,1);
    BlockSplitterFinishBlockCommand(pBVar1,1);
    BlockSplitterFinishBlockDistance(pBVar20,1);
    sVar16 = (mb->literal_split).num_types;
    mb->literal_context_map_size = sVar16 << 6;
    if (sVar16 << 6 == 0) {
      puVar15 = (uint32_t *)0x0;
    }
    else {
      puVar15 = (uint32_t *)BrotliAllocate(m_00,sVar16 << 8);
      sVar16 = (mb->literal_split).num_types;
    }
    mb->literal_context_map = puVar15;
    for (sVar17 = 0; sVar17 != sVar16; sVar17 = sVar17 + 1) {
      for (lVar19 = 0; lVar19 != 0x40; lVar19 = lVar19 + 1) {
        puVar15[lVar19] = static_context_map[lVar19] + (int)sVar17 * (int)num_contexts;
      }
      puVar15 = puVar15 + 0x40;
    }
  }
  BrotliFree(m_01,self);
  return;
}

Assistant:

void duckdb_brotli::BrotliBuildMetaBlockGreedy(MemoryManager* m,
                                const uint8_t* ringbuffer,
                                size_t pos,
                                size_t mask,
                                uint8_t prev_byte,
                                uint8_t prev_byte2,
                                ContextLut literal_context_lut,
                                size_t num_contexts,
                                const uint32_t* static_context_map,
                                const Command* commands,
                                size_t n_commands,
                                MetaBlockSplit* mb) {
  GreedyMetablockArena* arena = BROTLI_ALLOC(m, GreedyMetablockArena, 1);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(arena)) return;
  if (num_contexts == 1) {
    BrotliBuildMetaBlockGreedyInternal(m, arena, ringbuffer, pos, mask,
        prev_byte, prev_byte2, literal_context_lut, 1, NULL, commands,
        n_commands, mb);
  } else {
    BrotliBuildMetaBlockGreedyInternal(m, arena, ringbuffer, pos, mask,
        prev_byte, prev_byte2, literal_context_lut, num_contexts,
        static_context_map, commands, n_commands, mb);
  }
  BROTLI_FREE(m, arena);
}